

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qaccessibleobject.h
# Opt level: O0

void __thiscall QAccessibleApplication::~QAccessibleApplication(QAccessibleApplication *this)

{
  void *in_RDI;
  
  ~QAccessibleApplication((QAccessibleApplication *)0x971d5c);
  operator_delete(in_RDI,0x10);
  return;
}

Assistant:

class Q_GUI_EXPORT QAccessibleApplication : public QAccessibleObject
{
public:
    QAccessibleApplication();

    QWindow *window() const override;
    // relations
    int childCount() const override;
    int indexOfChild(const QAccessibleInterface*) const override;
    QAccessibleInterface *focusChild() const override;

    // navigation
    QAccessibleInterface *parent() const override;
    QAccessibleInterface *child(int index) const override;

    // properties and state
    QString text(QAccessible::Text t) const override;
    QAccessible::Role role() const override;
    QAccessible::State state() const override;
}